

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O0

void __thiscall ev3dev::motor::reset(motor *this)

{
  string *in_RDI;
  motor *unaff_retaddr;
  allocator local_29;
  string local_28 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"reset",&local_29);
  set_command(unaff_retaddr,in_RDI);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return;
}

Assistant:

void reset() { set_command("reset"); }